

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O2

void __thiscall
icu_63::IslamicCalendar::handleComputeFields
          (IslamicCalendar *this,int32_t julianDay,UErrorCode *status)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int64_t iVar7;
  IslamicCalendar *this_00;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int y;
  uint year;
  ulong uVar12;
  int iVar13;
  
  iVar9 = julianDay + -0x1dbb18;
  iVar13 = *(int *)&(this->super_Calendar).field_0x264;
  iVar4 = 0;
  switch(iVar13) {
  case 0:
    dVar1 = uprv_floor_63((double)iVar9 / 29.530588853);
    dVar2 = uprv_floor_63((double)(int)dVar1 * 29.530588853);
    this_00 = (IslamicCalendar *)status;
    dVar3 = moonAge((this->super_Calendar).fTime,status);
    if (U_ZERO_ERROR < *status) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    iVar13 = (uint)(0.0 < dVar3 && 0x18 < iVar9 - (int)dVar2) + (int)dVar1;
    do {
      iVar8 = iVar13;
      iVar4 = trueMonthStart(this_00,iVar8);
      iVar13 = iVar8 + -1;
    } while (iVar9 < iVar4);
    iVar4 = iVar8 % 0xc;
    year = iVar8 / 0xc + 1;
    goto LAB_001f8d3c;
  case 1:
  case 3:
    if (iVar13 == 3) {
      iVar9 = julianDay + -0x1dbb17;
    }
    iVar7 = ClockMath::floorDivide((long)iVar9 * 0x1e + 0x2996,0x2987);
    year = (uint)iVar7;
    iVar4 = yearStart(this,year);
    iVar13 = (iVar9 - iVar4) + -0x1d;
    break;
  case 2:
    iVar5 = yearStart(this,0x514);
    if (iVar5 <= iVar9) {
      lVar10 = 1;
      uVar12 = 0x513;
      do {
        year = (uint)uVar12;
        if (lVar10 < 1) goto LAB_001f8d3c;
        year = year + 1;
        uVar12 = (ulong)year;
        iVar5 = yearStart(this,year);
        iVar8 = (iVar9 - iVar5) + 1;
        iVar13 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])(this,(ulong)year);
        if (iVar8 == iVar13) {
          iVar4 = 0xb;
          goto LAB_001f8d3c;
        }
        lVar10 = (long)iVar8;
        iVar13 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])(this,uVar12);
      } while (iVar13 <= iVar8);
      uVar12 = 0;
      while( true ) {
        iVar4 = (int32_t)uVar12;
        iVar13 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x22])
                           (this,(ulong)year,uVar12);
        lVar11 = lVar10 - iVar13;
        if (lVar11 == 0 || lVar10 < iVar13) break;
        uVar12 = (ulong)(iVar4 + 1);
        lVar10 = lVar11;
      }
      goto LAB_001f8d3c;
    }
    dVar1 = uprv_floor_63((double)(iVar9 * 0x1e + 0x2996) / 10631.0);
    year = (uint)dVar1;
    iVar4 = yearStart(this,year);
    iVar13 = (julianDay - iVar4) + -0x1dbb35;
    break;
  default:
    year = 0;
    goto LAB_001f8d3c;
  }
  dVar1 = uprv_ceil_63((double)iVar13 / 29.5);
  iVar4 = 0xb;
  if ((int)dVar1 < 0xb) {
    iVar4 = (int)dVar1;
  }
  monthStart(this,year,iVar4);
LAB_001f8d3c:
  iVar5 = monthStart(this,year,iVar4);
  iVar6 = monthStart(this,year,0);
  (this->super_Calendar).fFields[0] = 0;
  (this->super_Calendar).fStamp[0] = 1;
  (this->super_Calendar).fIsSet[0] = '\x01';
  (this->super_Calendar).fFields[1] = year;
  (this->super_Calendar).fStamp[1] = 1;
  (this->super_Calendar).fStamp[2] = 1;
  (this->super_Calendar).fIsSet[1] = '\x01';
  (this->super_Calendar).fIsSet[2] = '\x01';
  (this->super_Calendar).fFields[0x13] = year;
  (this->super_Calendar).fStamp[0x13] = 1;
  (this->super_Calendar).fIsSet[0x13] = '\x01';
  (this->super_Calendar).fFields[2] = iVar4;
  (this->super_Calendar).fFields[5] = (iVar9 + 1) - iVar5;
  (this->super_Calendar).fStamp[5] = 1;
  (this->super_Calendar).fStamp[6] = 1;
  (this->super_Calendar).fIsSet[5] = '\x01';
  (this->super_Calendar).fIsSet[6] = '\x01';
  (this->super_Calendar).fFields[6] = (iVar9 + 1) - iVar6;
  return;
}

Assistant:

void IslamicCalendar::handleComputeFields(int32_t julianDay, UErrorCode &status) {
    int32_t year, month, dayOfMonth, dayOfYear;
    int32_t startDate;
    int32_t days = julianDay - CIVIL_EPOC;

    if (cType == CIVIL || cType == TBLA) {
        if(cType == TBLA) {
            days = julianDay - ASTRONOMICAL_EPOC;
        }
        // Use the civil calendar approximation, which is just arithmetic
        year  = (int32_t)ClockMath::floorDivide(30 * (int64_t)days + 10646, (int64_t)10631);
        month = (int32_t)uprv_ceil((days - 29 - yearStart(year)) / 29.5 );
        month = month<11?month:11;
        startDate = monthStart(year, month);
    } else if(cType == ASTRONOMICAL){
        // Guess at the number of elapsed full months since the epoch
        int32_t months = (int32_t)uprv_floor((double)days / CalendarAstronomer::SYNODIC_MONTH);

        startDate = (int32_t)uprv_floor(months * CalendarAstronomer::SYNODIC_MONTH);

        double age = moonAge(internalGetTime(), status);
        if (U_FAILURE(status)) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        if ( days - startDate >= 25 && age > 0) {
            // If we're near the end of the month, assume next month and search backwards
            months++;
        }

        // Find out the last time that the new moon was actually visible at this longitude
        // This returns midnight the night that the moon was visible at sunset.
        while ((startDate = trueMonthStart(months)) > days) {
            // If it was after the date in question, back up a month and try again
            months--;
        }

        year = months / 12 + 1;
        month = months % 12;
    } else if(cType == UMALQURA) {
        int32_t umalquraStartdays = yearStart(UMALQURA_YEAR_START) ;
        if( days < umalquraStartdays){
                //Use Civil calculation
                year  = (int)ClockMath::floorDivide( (double)(30 * days + 10646) , 10631.0 );
                month = (int32_t)uprv_ceil((days - 29 - yearStart(year)) / 29.5 );
                month = month<11?month:11;
                startDate = monthStart(year, month);
            }else{
                int y =UMALQURA_YEAR_START-1, m =0;
                long d = 1;
                while(d > 0){ 
                    y++; 
                    d = days - yearStart(y) +1;
                    if(d == handleGetYearLength(y)){
                        m=11;
                        break;
                    }else if(d < handleGetYearLength(y) ){
                        int monthLen = handleGetMonthLength(y, m); 
                        m=0;
                        while(d > monthLen){
                            d -= monthLen;
                            m++;
                            monthLen = handleGetMonthLength(y, m);
                        }
                        break;
                    }
                }
                year = y;
                month = m;
            }
    } else { // invalid 'civil'
      U_ASSERT(false); // should not get here, out of range
      year=month=0;
    }

    dayOfMonth = (days - monthStart(year, month)) + 1;

    // Now figure out the day of the year.
    dayOfYear = (days - monthStart(year, 0)) + 1;


    internalSet(UCAL_ERA, 0);
    internalSet(UCAL_YEAR, year);
    internalSet(UCAL_EXTENDED_YEAR, year);
    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DAY_OF_MONTH, dayOfMonth);
    internalSet(UCAL_DAY_OF_YEAR, dayOfYear);       
}